

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O2

uint64_t MurmurHash64B(void *key,int len,uint64_t seed)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = (uint)seed ^ len;
  uVar5 = seed >> 0x20;
  for (; uVar4 = (uint)uVar5, 7 < len; len = len + -8) {
    uVar3 = uVar3 * 0x5bd1e995 ^
            ((uint)(*key * 0x5bd1e995) >> 0x18 ^ *key * 0x5bd1e995) * 0x5bd1e995;
    pbVar1 = (byte *)((long)key + 4);
    key = (void *)((long)key + 8);
    uVar5 = (ulong)(uVar4 * 0x5bd1e995 ^
                   ((uint)(*(int *)pbVar1 * 0x5bd1e995) >> 0x18 ^ *(int *)pbVar1 * 0x5bd1e995) *
                   0x5bd1e995);
  }
  if (3 < len) {
    iVar2 = *key;
    key = (void *)((long)key + 4);
    len = len + -4;
    uVar3 = uVar3 * 0x5bd1e995 ^
            ((uint)(iVar2 * 0x5bd1e995) >> 0x18 ^ iVar2 * 0x5bd1e995) * 0x5bd1e995;
  }
  if (len != 1) {
    if (len != 2) {
      if (len != 3) goto LAB_0015dea8;
      uVar4 = uVar4 ^ (uint)*(byte *)((long)key + 2) << 0x10;
    }
    uVar4 = uVar4 ^ (uint)*(byte *)((long)key + 1) << 8;
  }
  uVar5 = (ulong)((*key ^ uVar4) * 0x5bd1e995);
LAB_0015dea8:
  uVar3 = ((uint)(uVar5 >> 0x12) ^ uVar3) * 0x5bd1e995;
  uVar4 = (uVar3 >> 0x16 ^ (uint)uVar5) * 0x5bd1e995;
  uVar3 = (uVar4 >> 0x11 ^ uVar3) * 0x5bd1e995;
  return CONCAT44(uVar3,(uVar3 >> 0x13 ^ uVar4) * 0x5bd1e995);
}

Assistant:

uint64_t MurmurHash64B ( const void * key, int len, uint64_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  uint32_t h1 = uint32_t(seed) ^ len;
  uint32_t h2 = uint32_t(seed >> 32);

  const uint32_t * data = (const uint32_t *)key;

  while(len >= 8)
  {
    uint32_t k1 = *data++;
    k1 *= m; k1 ^= k1 >> r; k1 *= m;
    h1 *= m; h1 ^= k1;
    len -= 4;

    uint32_t k2 = *data++;
    k2 *= m; k2 ^= k2 >> r; k2 *= m;
    h2 *= m; h2 ^= k2;
    len -= 4;
  }

  if(len >= 4)
  {
    uint32_t k1 = *data++;
    k1 *= m; k1 ^= k1 >> r; k1 *= m;
    h1 *= m; h1 ^= k1;
    len -= 4;
  }

  switch(len)
  {
  case 3: h2 ^= ((unsigned char*)data)[2] << 16;
  case 2: h2 ^= ((unsigned char*)data)[1] << 8;
  case 1: h2 ^= ((unsigned char*)data)[0];
      h2 *= m;
  };

  h1 ^= h2 >> 18; h1 *= m;
  h2 ^= h1 >> 22; h2 *= m;
  h1 ^= h2 >> 17; h1 *= m;
  h2 ^= h1 >> 19; h2 *= m;

  uint64_t h = h1;

  h = (h << 32) | h2;

  return h;
}